

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

ssize_t __thiscall
CgroupController::read(CgroupController *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  path local_70;
  path local_48;
  void *local_20;
  string *filename_local;
  CgroupController *this_local;
  
  local_20 = __buf;
  filename_local = (string *)CONCAT44(in_register_00000034,__fd);
  this_local = this;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
             auto_format);
  std::filesystem::__cxx11::operator/
            (&local_48,(path *)CONCAT44(in_register_00000034,__fd),&local_70);
  read_file((string *)this,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  return (ssize_t)this;
}

Assistant:

std::string CgroupController::read(const std::string &filename) {
    return read_file(path_ / filename);
}